

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_extu_i32_i64_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i64 ret,TCGv_i32 arg)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_ppc64(tcg_ctx,INDEX_op_extu_i32_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_extu_i32_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i32 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), arg);
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#else
        tcg_gen_op2(tcg_ctx, INDEX_op_extu_i32_i64,
                    tcgv_i64_arg(tcg_ctx, ret), tcgv_i32_arg(tcg_ctx, arg));
#endif
}